

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O0

void __thiscall Nes_Namco::run_until(Nes_Namco *this,cpu_time_t nes_end_time)

{
  Blip_Buffer *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  resampled_time_t rVar6;
  Blip_Synth<3,_15> *this_01;
  Blip_Synth<3,_15> *time_00;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  blip_time_t in_RSI;
  long in_RDI;
  int delta;
  int sample;
  int addr;
  int wave_pos;
  int last_amp;
  int wave_size;
  resampled_time_t period;
  long freq;
  int volume;
  uint8_t *osc_reg;
  resampled_time_t end_time;
  resampled_time_t time;
  Blip_Buffer *output;
  Namco_Osc *osc;
  int i;
  int active_oscs;
  uint local_6c;
  int local_64;
  int local_60;
  undefined4 in_stack_ffffffffffffffb8;
  int local_18;
  
  iVar1 = ((int)(uint)*(byte *)(in_RDI + 0x14b) >> 4 & 7U) + 1;
  local_18 = 8 - iVar1;
  do {
    if (7 < local_18) {
      *(blip_time_t *)(in_RDI + 0xc0) = in_RSI;
      return;
    }
    plVar5 = (long *)(in_RDI + (long)local_18 * 0x18);
    this_00 = (Blip_Buffer *)plVar5[1];
    if (this_00 != (Blip_Buffer *)0x0) {
      rVar6 = Blip_Buffer::resampled_time(this_00,*(blip_time_t *)(in_RDI + 0xc0));
      this_01 = (Blip_Synth<3,_15> *)(rVar6 + *plVar5);
      time_00 = (Blip_Synth<3,_15> *)Blip_Buffer::resampled_time(this_00,in_RSI);
      *plVar5 = 0;
      if (this_01 < time_00) {
        pbVar7 = (byte *)(in_RDI + 0xcc + (long)(local_18 * 8 + 0x40));
        if ((((pbVar7[4] & 0xe0) != 0) && (uVar2 = pbVar7[7] & 0xf, (pbVar7[7] & 0xf) != 0)) &&
           (uVar8 = (long)(int)((pbVar7[4] & 3) << 0x10) + (ulong)pbVar7[2] * 0x100 + (ulong)*pbVar7
           , uVar8 != 0)) {
          rVar6 = Blip_Buffer::resampled_duration(this_00,0xf0000);
          iVar3 = (8 - ((int)(uint)pbVar7[4] >> 2 & 7U)) * 4;
          if (iVar3 != 0) {
            local_60 = (int)(short)plVar5[2];
            local_64 = (int)*(short *)((long)plVar5 + 0x12);
            do {
              uVar9 = local_64 + (uint)pbVar7[6];
              local_6c = (uint)*(byte *)(in_RDI + 0xcc + (long)((int)uVar9 >> 1));
              local_64 = local_64 + 1;
              if ((uVar9 & 1) != 0) {
                local_6c = (int)local_6c >> 4;
              }
              iVar4 = (local_6c & 0xf) * uVar2;
              if (iVar4 - local_60 != 0) {
                Blip_Synth<3,_15>::offset_resampled
                          (this_01,(blip_resampled_time_t)time_00,(int)((ulong)pbVar7 >> 0x20),
                           (Blip_Buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
                local_60 = iVar4;
              }
              this_01 = (Blip_Synth<3,_15> *)
                        ((long)this_01->impulses + (rVar6 / uVar8) * (long)iVar1);
              if (iVar3 <= local_64) {
                local_64 = 0;
              }
            } while (this_01 < time_00);
            *(short *)((long)plVar5 + 0x12) = (short)local_64;
            *(short *)(plVar5 + 2) = (short)local_60;
            goto LAB_0011c3d9;
          }
        }
      }
      else {
LAB_0011c3d9:
        *plVar5 = (long)this_01 - (long)time_00;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Nes_Namco::run_until( cpu_time_t nes_end_time )
{
	int active_oscs = ((reg [0x7f] >> 4) & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		
		Blip_Buffer::resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		Blip_Buffer::resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xe0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( !freq )
				continue;
			Blip_Buffer::resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = (8 - ((osc_reg [4] >> 2) & 7)) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1];
				wave_pos++;
				if ( addr & 1 )
					sample >>= 4;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}